

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall luna::Lexer::LexStringChar(Lexer *this)

{
  char cVar1;
  int iVar2;
  char (*args) [30];
  char *pcVar3;
  undefined8 uVar4;
  LexException *in_RDI;
  bool bVar5;
  int i_1;
  char oct [4];
  int i;
  char hex [3];
  Lexer *in_stack_ffffffffffffff90;
  char (*in_stack_ffffffffffffffb8) [29];
  undefined8 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar6;
  int local_24;
  char local_20 [16];
  int local_10;
  char local_b [11];
  
  if (*(int *)&in_RDI[1].super_Exception.field_0x10 == 0x5c) {
    iVar2 = Next(in_stack_ffffffffffffff90);
    *(int *)&in_RDI[1].super_Exception.field_0x10 = iVar2;
    cVar1 = (char)in_RDI;
    if (*(int *)&in_RDI[1].super_Exception.field_0x10 == 0x61) {
      std::__cxx11::string::push_back(cVar1 + '@');
    }
    else if (*(int *)&in_RDI[1].super_Exception.field_0x10 == 0x62) {
      std::__cxx11::string::push_back(cVar1 + '@');
    }
    else if (*(int *)&in_RDI[1].super_Exception.field_0x10 == 0x66) {
      std::__cxx11::string::push_back(cVar1 + '@');
    }
    else if (*(int *)&in_RDI[1].super_Exception.field_0x10 == 0x6e) {
      std::__cxx11::string::push_back(cVar1 + '@');
    }
    else if (*(int *)&in_RDI[1].super_Exception.field_0x10 == 0x72) {
      std::__cxx11::string::push_back(cVar1 + '@');
    }
    else if (*(int *)&in_RDI[1].super_Exception.field_0x10 == 0x74) {
      std::__cxx11::string::push_back(cVar1 + '@');
    }
    else if (*(int *)&in_RDI[1].super_Exception.field_0x10 == 0x76) {
      std::__cxx11::string::push_back(cVar1 + '@');
    }
    else if (*(int *)&in_RDI[1].super_Exception.field_0x10 == 0x5c) {
      std::__cxx11::string::push_back(cVar1 + '@');
    }
    else if (*(int *)&in_RDI[1].super_Exception.field_0x10 == 0x22) {
      std::__cxx11::string::push_back(cVar1 + '@');
    }
    else {
      if (*(int *)&in_RDI[1].super_Exception.field_0x10 != 0x27) {
        if (*(int *)&in_RDI[1].super_Exception.field_0x10 != 0x78) {
          iVar2 = isdigit(*(int *)&in_RDI[1].super_Exception.field_0x10);
          if (iVar2 != 0) {
            memset(local_20,0,4);
            local_24 = 0;
            while( true ) {
              bVar5 = false;
              if (local_24 < 3) {
                iVar2 = isdigit(*(int *)&in_RDI[1].super_Exception.field_0x10);
                bVar5 = iVar2 != 0;
              }
              if (!bVar5) break;
              local_20[local_24] = (char)*(undefined4 *)&in_RDI[1].super_Exception.field_0x10;
              local_24 = local_24 + 1;
              iVar2 = Next(in_stack_ffffffffffffff90);
              *(int *)&in_RDI[1].super_Exception.field_0x10 = iVar2;
            }
            strtoul(local_20,(char **)0x0,8);
            std::__cxx11::string::push_back((char)in_RDI + '@');
            return;
          }
          uVar4 = __cxa_allocate_exception(0x20);
          String::GetCStr(*(String **)&(in_RDI->super_Exception).field_0x8);
          LexException::LexException<char_const(&)[29]>
                    (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                     (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8);
          __cxa_throw(uVar4,&LexException::typeinfo,LexException::~LexException);
        }
        iVar2 = Next(in_stack_ffffffffffffff90);
        *(int *)&in_RDI[1].super_Exception.field_0x10 = iVar2;
        memset(local_b,0,3);
        local_10 = 0;
        while( true ) {
          uVar6 = false;
          if (local_10 < 2) {
            uVar6 = anon_unknown.dwarf_4d2df::IsHexChar
                              (*(int *)&in_RDI[1].super_Exception.field_0x10);
          }
          if ((bool)uVar6 == false) break;
          local_b[local_10] = (char)*(undefined4 *)&in_RDI[1].super_Exception.field_0x10;
          local_10 = local_10 + 1;
          iVar2 = Next(in_stack_ffffffffffffff90);
          *(int *)&in_RDI[1].super_Exception.field_0x10 = iVar2;
        }
        if (local_10 != 0) {
          strtoul(local_b,(char **)0x0,0x10);
          std::__cxx11::string::push_back((char)in_RDI + '@');
          return;
        }
        args = (char (*) [30])__cxa_allocate_exception(0x20);
        pcVar3 = String::GetCStr(*(String **)&(in_RDI->super_Exception).field_0x8);
        LexException::LexException<char_const(&)[30]>
                  (in_RDI,(char *)CONCAT17(uVar6,in_stack_ffffffffffffffc8),
                   (int)((ulong)pcVar3 >> 0x20),(int)pcVar3,args);
        __cxa_throw(args,&LexException::typeinfo,LexException::~LexException);
      }
      std::__cxx11::string::push_back(cVar1 + '@');
    }
  }
  else {
    std::__cxx11::string::push_back((char)in_RDI + '@');
  }
  iVar2 = Next(in_stack_ffffffffffffff90);
  *(int *)&in_RDI[1].super_Exception.field_0x10 = iVar2;
  return;
}

Assistant:

void Lexer::LexStringChar()
    {
        if (current_ == '\\')
        {
            current_ = Next();
            if (current_ == 'a')
                token_buffer_.push_back('\a');
            else if (current_ == 'b')
                token_buffer_.push_back('\b');
            else if (current_ == 'f')
                token_buffer_.push_back('\f');
            else if (current_ == 'n')
                token_buffer_.push_back('\n');
            else if (current_ == 'r')
                token_buffer_.push_back('\r');
            else if (current_ == 't')
                token_buffer_.push_back('\t');
            else if (current_ == 'v')
                token_buffer_.push_back('\v');
            else if (current_ == '\\')
                token_buffer_.push_back('\\');
            else if (current_ == '"')
                token_buffer_.push_back('"');
            else if (current_ == '\'')
                token_buffer_.push_back('\'');
            else if (current_ == 'x')
            {
                current_ = Next();
                char hex[3] = { 0 };
                int i = 0;
                for (; i < 2 && IsHexChar(current_); ++i, current_ = Next())
                    hex[i] = current_;
                if (i == 0)
                    throw LexException(module_->GetCStr(), line_, column_,
                            "unexpect character after '\\x'");
                token_buffer_.push_back(static_cast<char>(strtoul(hex, 0, 16)));
                return ;
            }
            else if (isdigit(current_))
            {
                char oct[4] = { 0 };
                for (int i = 0; i < 3 && isdigit(current_); ++i, current_ = Next())
                    oct[i] = current_;
                token_buffer_.push_back(static_cast<char>(strtoul(oct, 0, 8)));
                return ;
            }
            else
                throw LexException(module_->GetCStr(), line_, column_,
                        "unexpect character after '\\'");
        }
        else
        {
            token_buffer_.push_back(current_);
        }

        current_ = Next();
    }